

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_str_offsets.c
# Opt level: O1

int dwarf_str_offsets_statistics
              (Dwarf_Str_Offsets_Table table_data,Dwarf_Unsigned *wasted_byte_count,
              Dwarf_Unsigned *table_count,Dwarf_Error *error)

{
  Dwarf_Signed errval;
  Dwarf_Debug dbg;
  
  if (table_data == (Dwarf_Str_Offsets_Table)0x0) {
    errval = 0x192;
  }
  else {
    dbg = table_data->so_dbg;
    if (dbg != (Dwarf_Debug)0x0) {
      if (table_data->so_magic_value == 0x2feed2) {
        if (wasted_byte_count != (Dwarf_Unsigned *)0x0) {
          *wasted_byte_count = table_data->so_wasted_section_bytes;
        }
        if (table_count == (Dwarf_Unsigned *)0x0) {
          return 0;
        }
        *table_count = table_data->so_table_count;
        return 0;
      }
      errval = 0x194;
      goto LAB_001cb8e6;
    }
    errval = 0x193;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_001cb8e6:
  _dwarf_error(dbg,error,errval);
  return 1;
}

Assistant:

int
dwarf_str_offsets_statistics(Dwarf_Str_Offsets_Table table_data,
    Dwarf_Unsigned * wasted_byte_count,
    Dwarf_Unsigned * table_count,
    Dwarf_Error    * error)
{
    VALIDATE_SOT(table_data)
    if (wasted_byte_count) {
        *wasted_byte_count = table_data->so_wasted_section_bytes;
    }
    if (table_count) {
        *table_count = table_data->so_table_count;
    }
    return DW_DLV_OK;
}